

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O3

time_t isodate17(uchar *v)

{
  uchar uVar1;
  time_t tVar2;
  tm local_38;
  
  local_38.tm_gmtoff = 0;
  local_38.tm_zone = (char *)0x0;
  local_38.tm_wday = 0;
  local_38.tm_yday = 0;
  local_38.tm_isdst = 0;
  local_38._36_4_ = 0;
  local_38.tm_year =
       (v[3] - 0xd7bc) + (uint)v[1] * 100 + (uint)*v * 1000 + ((uint)v[2] + (uint)v[2] * 4) * 2;
  local_38.tm_mon = (v[5] - 0x211) + ((uint)v[4] + (uint)v[4] * 4) * 2;
  local_38.tm_mday = (uint)v[7] + ((uint)v[6] + (uint)v[6] * 4) * 2 + -0x210;
  local_38.tm_hour = (uint)v[9] + ((uint)v[8] + (uint)v[8] * 4) * 2 + -0x210;
  local_38.tm_min = (uint)v[0xb] + ((uint)v[10] + (uint)v[10] * 4) * 2 + -0x210;
  local_38.tm_sec = (uint)v[0xd] + ((uint)v[0xc] + (uint)v[0xc] * 4) * 2 + -0x210;
  uVar1 = v[0x10];
  if ((byte)(uVar1 + 0x2f) < 99) {
    local_38.tm_hour =
         local_38.tm_hour + (char)-((char)(((byte)((char)uVar1 >> 7) >> 6) + uVar1) >> 2);
    local_38.tm_min = local_38.tm_min + (char)(((char)uVar1 % '\x04') * -0xf);
  }
  tVar2 = timegm(&local_38);
  if (tVar2 == -1) {
    tVar2 = 0;
  }
  return tVar2;
}

Assistant:

static time_t
isodate17(const unsigned char *v)
{
	struct tm tm;
	int offset;
	time_t t;

	memset(&tm, 0, sizeof(tm));
	tm.tm_year = (v[0] - '0') * 1000 + (v[1] - '0') * 100
	    + (v[2] - '0') * 10 + (v[3] - '0')
	    - 1900;
	tm.tm_mon = (v[4] - '0') * 10 + (v[5] - '0') - 1;
	tm.tm_mday = (v[6] - '0') * 10 + (v[7] - '0');
	tm.tm_hour = (v[8] - '0') * 10 + (v[9] - '0');
	tm.tm_min = (v[10] - '0') * 10 + (v[11] - '0');
	tm.tm_sec = (v[12] - '0') * 10 + (v[13] - '0');
	/* v[16] is the signed timezone offset, in 1/4-hour increments. */
	offset = ((const signed char *)v)[16];
	if (offset > -48 && offset < 52) {
		tm.tm_hour -= offset / 4;
		tm.tm_min -= (offset % 4) * 15;
	}
	t = time_from_tm(&tm);
	if (t == (time_t)-1)
		return ((time_t)0);
	return (t);
}